

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_file.cpp
# Opt level: O1

void __thiscall foxxll::memory_file::discard(memory_file *this)

{
  offset_type in_RDX;
  offset_type in_RSI;
  
  discard((memory_file *)
          ((long)&(this->super_disk_queued_file)._vptr_disk_queued_file +
          (long)(this->super_disk_queued_file)._vptr_disk_queued_file[-0xb]),in_RSI,in_RDX);
  return;
}

Assistant:

void memory_file::discard(offset_type offset, offset_type size)
{
    std::unique_lock<std::mutex> lock(mutex_);
#ifndef FOXXLL_MEMFILE_DONT_CLEAR_FREED_MEMORY
    // overwrite the freed region with uninitialized memory
    TLX_LOG1 << "discard at " << offset << " len " << size;
    void* uninitialized = malloc(BlockAlignment);
    while (size >= BlockAlignment) {
        memcpy(ptr_ + offset, uninitialized, BlockAlignment);
        offset += BlockAlignment;
        size -= BlockAlignment;
    }
    assert(size <= std::numeric_limits<offset_type>::max());
    if (size > 0)
        memcpy(ptr_ + offset, uninitialized, static_cast<size_t>(size));
    free(uninitialized);
#else
    tlx::unused(offset);
    tlx::unused(size);
#endif
}